

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall QAbstractItemView::viewportEvent(QAbstractItemView *this,QEvent *event)

{
  ushort uVar1;
  QAbstractItemViewPrivate *this_00;
  undefined1 *puVar2;
  undefined1 uVar3;
  uint uVar4;
  long *plVar5;
  QScroller *signal;
  QModelIndex *this_01;
  long in_FS_OFFSET;
  QPointF QVar6;
  QStatusTipEvent tip;
  QModelIndex local_140;
  QModelIndex local_128;
  QPoint local_110;
  undefined1 local_108 [8];
  quintptr qStack_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  uVar1 = *(ushort *)(event + 8);
  switch(uVar1) {
  case 0x7b:
switchD_004e2671_caseD_7b:
    local_128.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_128.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this + 0x1f0))(&local_128,this,event + 0x10);
    memset((QStyleOptionViewItem *)local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_108);
    (**(code **)(*(long *)this + 0x2f8))(this,(QStyleOptionViewItem *)local_108);
    local_f8 = (**(code **)(*(long *)this + 0x1e0))(this,&local_128);
    currentIndex(&local_140,this);
    uVar4 = 0;
    if (((local_128.r == local_140.r) && (uVar4 = 0, local_128.c == local_140.c)) &&
       (local_128.i == local_140.i)) {
      uVar4 = (uint)(local_128.m.ptr == local_140.m.ptr) << 8;
    }
    qStack_100 = CONCAT44(qStack_100._4_4_,(uint)qStack_100._0_4_ | uVar4);
    plVar5 = (long *)(**(code **)(*(long *)this + 0x208))(this,&local_128);
    if (plVar5 == (long *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*plVar5 + 0xa0))(plVar5,event,this,local_108,&local_128);
    }
    QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)local_108);
    goto LAB_004e2978;
  case 0x7c:
  case 0x7d:
  case 0x7e:
    break;
  case 0x7f:
  case 0x81:
    QVar6 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_128.i = (quintptr)QVar6.yp;
    local_128._0_8_ = QVar6.xp;
    local_110 = QPointF::toPoint((QPointF *)&local_128);
    (**(code **)(*(long *)this + 0x1f0))((QModelIndex *)local_108,this);
    this_01 = &local_140;
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)this_01,(QModelIndex *)local_108);
    QAbstractItemViewPrivate::setHoverIndex(this_00,(QPersistentModelIndex *)this_01);
    goto LAB_004e2811;
  case 0x80:
    local_108 = (undefined1  [8])0xffffffffffffffff;
    qStack_100 = 0;
    local_f8._0_8_ = (QAbstractItemModel *)0x0;
    this_01 = &local_128;
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)this_01,(QModelIndex *)local_108);
    QAbstractItemViewPrivate::setHoverIndex(this_00,(QPersistentModelIndex *)this_01);
LAB_004e2811:
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_01);
    break;
  default:
    if (uVar1 - 0x18 < 2) {
      QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
    }
    else {
      if (uVar1 - 0x6e < 2) goto switchD_004e2671_caseD_7b;
      if (uVar1 == 10) {
        this_00->viewportEnteredNeeded = true;
      }
      else if (uVar1 == 0xb) {
        local_108._0_4_ = -1;
        local_108._4_4_ = -1;
        qStack_100 = 0;
        local_f8._0_8_ = (QAbstractItemModel *)0x0;
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_128,(QModelIndex *)local_108);
        QAbstractItemViewPrivate::setHoverIndex(this_00,(QPersistentModelIndex *)&local_128);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_128);
        if ((this_00->shouldClearStatusTip == true) &&
           (*(long *)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x10 != 0)) {
          local_128.m.ptr = (QAbstractItemModel *)0x0;
          local_128._0_8_ = (undefined1 *)0x0;
          local_128.i = 0;
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_108 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          qStack_100 = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_108,(QString *)&local_128);
          QCoreApplication::sendEvent
                    (*(QObject **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x10,(QEvent *)local_108);
          this_00->shouldClearStatusTip = false;
          QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128)
          ;
        }
        local_108 = (undefined1  [8])0xffffffffffffffff;
        qStack_100 = 0;
        local_f8._0_8_ = (QAbstractItemModel *)0x0;
        QPersistentModelIndex::operator=(&this_00->enteredIndex,(QModelIndex *)local_108);
      }
      else if (uVar1 == 0xcc) {
        executeDelayedItemsLayout(this);
        signal = QScroller::scroller(&((this_00->super_QAbstractScrollAreaPrivate).viewport)->
                                      super_QObject);
        local_108 = (undefined1  [8])QAbstractItemViewPrivate::scrollerStateChanged;
        qStack_100 = 0;
        QObjectPrivate::
        connect<void(QScroller::*)(QScroller::State),void(QAbstractItemViewPrivate::*)()>
                  ((Object *)&local_128,(offset_in_QScroller_to_subr)signal,
                   (Object *)QScroller::stateChanged,0,(ConnectionType)this_00);
        puVar2 = (undefined1 *)(this_00->scollerConnection).d_ptr;
        (this_00->scollerConnection).d_ptr = (void *)local_128._0_8_;
        local_128._0_8_ = puVar2;
        QMetaObject::Connection::~Connection((Connection *)&local_128);
      }
      else if (uVar1 == 0x61) {
        QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
      }
      else if (uVar1 == 0xc) {
        QAbstractItemViewPrivate::executePostedLayout(this_00);
      }
    }
  }
  uVar3 = QAbstractScrollArea::viewportEvent((QAbstractScrollArea *)this,event);
LAB_004e2978:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QAbstractItemView::viewportEvent(QEvent *event)
{
    Q_D(QAbstractItemView);
    switch (event->type()) {
    case QEvent::Paint:
        // Similar to pre-painting in QAbstractItemView::event to update scrollbar
        // visibility, make sure that all pending layout requests have been executed
        // so that the view's data structures are up-to-date before rendering.
        d->executePostedLayout();
        break;
    case QEvent::HoverMove:
    case QEvent::HoverEnter:
        d->setHoverIndex(indexAt(static_cast<QHoverEvent*>(event)->position().toPoint()));
        break;
    case QEvent::HoverLeave:
        d->setHoverIndex(QModelIndex());
        break;
    case QEvent::Enter:
        d->viewportEnteredNeeded = true;
        break;
    case QEvent::Leave:
        d->setHoverIndex(QModelIndex()); // If we've left, no hover should be needed anymore
    #if QT_CONFIG(statustip)
        if (d->shouldClearStatusTip && d->parent) {
            QString empty;
            QStatusTipEvent tip(empty);
            QCoreApplication::sendEvent(d->parent, &tip);
            d->shouldClearStatusTip = false;
        }
    #endif
        d->enteredIndex = QModelIndex();
        break;
    case QEvent::ToolTip:
    case QEvent::QueryWhatsThis:
    case QEvent::WhatsThis: {
        QHelpEvent *he = static_cast<QHelpEvent*>(event);
        const QModelIndex index = indexAt(he->pos());
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        option.rect = visualRect(index);
        option.state |= (index == currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

        QAbstractItemDelegate *delegate = itemDelegateForIndex(index);
        if (!delegate)
            return false;
        return delegate->helpEvent(he, this, option, index);
    }
    case QEvent::FontChange:
        d->doDelayedItemsLayout(); // the size of the items will change
        break;
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->viewport->update();
        break;
    case QEvent::ScrollPrepare:
        executeDelayedItemsLayout();
#if QT_CONFIG(gestures) && QT_CONFIG(scroller)
        d->scollerConnection = QObjectPrivate::connect(
              QScroller::scroller(d->viewport), &QScroller::stateChanged,
              d, &QAbstractItemViewPrivate::scrollerStateChanged,
              Qt::UniqueConnection);
#endif
        break;

    default:
        break;
    }
    return QAbstractScrollArea::viewportEvent(event);
}